

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetterFromDescriptor<false>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<unsigned_short> *descriptor,Var *setterValue,
          PropertyValueInfo *info)

{
  PropertyAttributes PVar1;
  unsigned_short uVar2;
  Var pvVar3;
  DescriptorFlags DVar4;
  
  DVar4 = None;
  if ((descriptor->Attributes & 8) == 0) {
    uVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(descriptor);
    if (uVar2 == 0xffff) {
      uVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
      DVar4 = None;
      if (uVar2 != 0xffff) {
        uVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        pvVar3 = DynamicObject::GetSlot(instance,(uint)uVar2);
        *setterValue = pvVar3;
        uVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        DVar4 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          PVar1 = descriptor->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar2;
          info->m_attributes = PVar1;
          info->flags = InlineCacheSetterFlag;
        }
      }
    }
    else if ((descriptor->Attributes & 4) == 0) {
      DVar4 = (uint)(descriptor->Attributes >> 7) * 8 + Data;
    }
    else {
      DVar4 = WritableData;
    }
  }
  return DVar4;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }